

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

int __thiscall glslang::TScanContext::secondGenerationImage(TScanContext *this)

{
  EProfile EVar1;
  int iVar2;
  TParseContextBase *pTVar3;
  
  pTVar3 = this->parseContext;
  EVar1 = (pTVar3->super_TParseVersions).profile;
  if ((EVar1 == EEsProfile) && (0x135 < (pTVar3->super_TParseVersions).version)) {
    reservedWord(this);
  }
  else if (3 < (int)((ulong)((long)(pTVar3->symbolTable->table).
                                   super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pTVar3->symbolTable->table).
                                  super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    if (EVar1 == EEsProfile) {
LAB_0042e6d0:
      if ((pTVar3->super_TParseVersions).forwardCompatible == true) {
        (*(pTVar3->super_TParseVersions)._vptr_TParseVersions[0x2e])
                  (pTVar3,&this->loc,"using future type keyword",this->tokenText,"");
      }
      iVar2 = identifierOrType(this);
      return iVar2;
    }
    if ((pTVar3->super_TParseVersions).version < 0x1a4) {
      iVar2 = (*(pTVar3->super_TParseVersions)._vptr_TParseVersions[8])
                        (pTVar3,"GL_ARB_shader_image_load_store");
      if ((char)iVar2 == '\0') {
        pTVar3 = this->parseContext;
        goto LAB_0042e6d0;
      }
    }
  }
  return this->keyword;
}

Assistant:

int TScanContext::secondGenerationImage()
{
    if (parseContext.isEsProfile() && parseContext.version >= 310) {
        reservedWord();
        return keyword;
    }

    if (parseContext.symbolTable.atBuiltInLevel() ||
        (!parseContext.isEsProfile() &&
         (parseContext.version >= 420 || parseContext.extensionTurnedOn(E_GL_ARB_shader_image_load_store))))
        return keyword;

    if (parseContext.isForwardCompatible())
        parseContext.warn(loc, "using future type keyword", tokenText, "");

    return identifierOrType();
}